

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_err.c
# Opt level: O3

void lj_err_run(lua_State *L)

{
  uint uVar1;
  TValue *pTVar2;
  GCstr *pGVar3;
  ulong uVar4;
  TValue *pTVar5;
  uint *puVar6;
  void *pvVar7;
  ulong uVar8;
  long lVar9;
  
  uVar4 = (ulong)(L->glref).ptr32;
  if (*(int *)(uVar4 + 400) == 0) {
    pTVar5 = L->base + -1;
    pTVar2 = (TValue *)(ulong)(L->stack).ptr32;
    pvVar7 = L->cframe;
    if (pvVar7 != (void *)0x0 && pTVar2 < pTVar5) {
      do {
        if ((*(int *)(((ulong)pvVar7 & 0xfffffffffffffffc) + 0x10) < 0) &&
           (pTVar5 < (TValue *)((long)pTVar2 - (long)*(int *)((long)pvVar7 + 0x10)))) {
          lVar9 = (long)*(int *)((long)pvVar7 + 0x14);
          if (-1 < lVar9) goto LAB_00113f9b;
          pvVar7 = *(void **)((long)pvVar7 + 0x30);
          goto LAB_00113f15;
        }
        uVar1 = (pTVar5->field_2).it;
        switch(uVar1 & 7) {
        default:
          pTVar5 = pTVar5 + (-1 - (ulong)*(byte *)((ulong)uVar1 - 3));
          goto LAB_00113f78;
        case 1:
          pvVar7 = *(void **)((long)pvVar7 + 0x30);
          break;
        case 2:
          if (pTVar5[-1].u32.lo == 1) {
LAB_00113f60:
            pvVar7 = *(void **)((long)pvVar7 + 0x30);
          }
          uVar8 = (long)(int)uVar1 & 0xfffffffffffffff8;
          goto LAB_00113f75;
        case 3:
          break;
        case 5:
          if (((ulong)pvVar7 & 1) == 0) {
            lVar9 = (long)*(int *)((long)pvVar7 + 0x14);
            if (lVar9 < 0) goto LAB_00113f60;
            goto LAB_00113f9b;
          }
          goto LAB_00113fa0;
        case 6:
        case 7:
          puVar6 = (uint *)((long)pTVar5 - (long)(int)(uVar1 & 0xfffffff8));
          if (*(char *)((ulong)*puVar6 + 6) == '\x15') {
            lVar9 = (long)puVar6 + (8 - (long)pTVar2);
LAB_00113f9b:
            if (lVar9 != 0) {
              pTVar5 = L->top;
              puVar6 = (uint *)(uVar4 + 0x31c);
              *puVar6 = *puVar6 & 0xffffffef;
              if ((*(int *)((long)pTVar2 + lVar9 + 4) != -9) || (L->status == '\x05')) {
                pGVar3 = lj_err_str(L,LJ_ERR_ERRERR);
                pTVar5[-1].u32.lo = (uint32_t)pGVar3;
                *(undefined4 *)((long)pTVar5 + -4) = 0xfffffffb;
                lj_err_throw(L,5);
              }
              L->status = '\x05';
              *pTVar5 = pTVar5[-1];
              pTVar5[-1] = *(TValue *)((long)pTVar2 + lVar9);
              L->top = pTVar5 + 1;
              lj_vm_call(L,pTVar5,2);
            }
          }
          goto LAB_00113fa0;
        }
        uVar8 = (ulong)(int)(uVar1 & 0xfffffff8);
LAB_00113f75:
        pTVar5 = (TValue *)((long)pTVar5 - uVar8);
LAB_00113f78:
        if (pTVar5 <= pTVar2) break;
LAB_00113f15:
      } while (pvVar7 != (void *)0x0);
    }
  }
LAB_00113fa0:
  lj_err_throw(L,2);
}

Assistant:

LJ_FASTCALL lj_err_run(lua_State *L)
{
  ptrdiff_t ef = (LJ_HASJIT && tvref(G(L)->jit_base)) ? 0 : finderrfunc(L);
  if (ef) {
    TValue *errfunc = restorestack(L, ef);
    TValue *top = L->top;
    lj_trace_abort(G(L));
    if (!tvisfunc(errfunc) || L->status == LUA_ERRERR) {
      setstrV(L, top-1, lj_err_str(L, LJ_ERR_ERRERR));
      lj_err_throw(L, LUA_ERRERR);
    }
    L->status = LUA_ERRERR;
    copyTV(L, top+LJ_FR2, top-1);
    copyTV(L, top-1, errfunc);
    if (LJ_FR2) setnilV(top++);
    L->top = top+1;
    lj_vm_call(L, top, 1+1);  /* Stack: |errfunc|msg| -> |msg| */
  }
  lj_err_throw(L, LUA_ERRRUN);
}